

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bip32.c
# Opt level: O0

int bip32_key_from_base58(char *base58,ext_key *output)

{
  size_t local_80;
  size_t written;
  uchar bytes [82];
  int ret;
  ext_key *output_local;
  char *base58_local;
  
  unique0x1000006f = output;
  bytes._76_4_ = wally_base58_to_bytes(base58,1,(uchar *)&written,0x52,&local_80);
  base58_local._4_4_ = bytes._76_4_;
  if (bytes._76_4_ == 0) {
    if (local_80 == 0x4e) {
      bytes._76_4_ = bip32_key_unserialize((uchar *)&written,0x4e,stack0xffffffffffffffe0);
    }
    else {
      bytes[0x4c] = 0xfe;
      bytes[0x4d] = 0xff;
      bytes[0x4e] = 0xff;
      bytes[0x4f] = 0xff;
    }
    wally_clear(&written,0x52);
    base58_local._4_1_ = bytes[0x4c];
    base58_local._5_1_ = bytes[0x4d];
    base58_local._6_1_ = bytes[0x4e];
    base58_local._7_1_ = bytes[0x4f];
  }
  return base58_local._4_4_;
}

Assistant:

int bip32_key_from_base58(const char *base58,
                          struct ext_key *output)
{
    int ret;
    unsigned char bytes[BIP32_SERIALIZED_LEN + BASE58_CHECKSUM_LEN];
    size_t written;

    if ((ret = wally_base58_to_bytes(base58, BASE58_FLAG_CHECKSUM, bytes, sizeof(bytes), &written)))
        return ret;

    if (written != BIP32_SERIALIZED_LEN)
        ret = WALLY_EINVAL;
    else
        ret = bip32_key_unserialize(bytes, BIP32_SERIALIZED_LEN, output);

    wally_clear(bytes, sizeof(bytes));
    return ret;
}